

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANAplanner.cpp
# Opt level: O0

void __thiscall
anaPlanner::anaPlanner(anaPlanner *this,DiscreteSpaceInformation *environment,bool bSearchForward)

{
  int iVar1;
  FILE *pFVar2;
  DiscreteSpaceInformation *pDVar3;
  byte in_DL;
  DiscreteSpaceInformation *in_RSI;
  SBPLPlanner *in_RDI;
  anaSearchStateSpace_t *in_stack_ffffffffffffffd8;
  anaPlanner *in_stack_ffffffffffffffe0;
  
  SBPLPlanner::SBPLPlanner(in_RDI);
  in_RDI->_vptr_SBPLPlanner = (_func_int **)&PTR_replan_001db570;
  *(byte *)&in_RDI[2]._vptr_SBPLPlanner = in_DL & 1;
  in_RDI->environment_ = in_RSI;
  *(undefined1 *)((long)&in_RDI[2]._vptr_SBPLPlanner + 1) = 0;
  in_RDI[1]._vptr_SBPLPlanner = (_func_int **)0x40f86a0000000000;
  *(undefined4 *)&in_RDI[3]._vptr_SBPLPlanner = 0;
  *(undefined4 *)((long)&in_RDI[3]._vptr_SBPLPlanner + 4) = 0;
  pFVar2 = fopen("debug.txt","w");
  in_RDI[4]._vptr_SBPLPlanner = (_func_int **)pFVar2;
  pDVar3 = (DiscreteSpaceInformation *)operator_new(0x58);
  anaSEARCHSTATESPACE::anaSEARCHSTATESPACE((anaSEARCHSTATESPACE *)0x19767e);
  in_RDI[2].environment_ = pDVar3;
  iVar1 = CreateSearchStateSpace(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (iVar1 == 1) {
    iVar1 = InitializeSearchStateSpace(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    if (iVar1 != 1) {
      printf("ERROR: failed to create statespace\n");
    }
  }
  else {
    printf("ERROR: failed to create statespace\n");
  }
  return;
}

Assistant:

anaPlanner::anaPlanner(DiscreteSpaceInformation* environment, bool bSearchForward)
{
    bforwardsearch = bSearchForward;

    environment_ = environment;

    bsearchuntilfirstsolution = false;
    finitial_eps = ana_DEFAULT_INITIAL_EPS;
    searchexpands = 0;
    MaxMemoryCounter = 0;

    fDeb = fopen("debug.txt", "w");

    pSearchStateSpace_ = new anaSearchStateSpace_t;

    //create the ana planner
    if (CreateSearchStateSpace(pSearchStateSpace_) != 1) {
        printf("ERROR: failed to create statespace\n");
        return;
    }

    //set the start and goal states
    if (InitializeSearchStateSpace(pSearchStateSpace_) != 1) {
        printf("ERROR: failed to create statespace\n");
        return;
    }
}